

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetUserArray
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  _func_int **pp_Var1;
  DObject *self_00;
  bool bVar2;
  bool local_63;
  PArray *arraytype;
  PField *local_50;
  PField *var;
  int local_40;
  int value;
  int pos;
  FName varname;
  DObject *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133b,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133b,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  _pos = (DObject *)(param->field_0).field_1.a;
  local_63 = true;
  if (_pos != (DObject *)0x0) {
    local_63 = DObject::IsKindOf(_pos,DObject::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133b,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133c,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133c,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  FName::FName((FName *)&value,param[1].field_0.i);
  self_00 = _pos;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133d,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133d,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_40 = param[2].field_0.i;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133e,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x133e,
                  "int AF_AActor_A_SetUserArray(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  var._4_4_ = param[3].field_0.i;
  FName::FName((FName *)((long)&arraytype + 4),(FName *)&value);
  local_50 = GetArrayVar(self_00,(FName *)((long)&arraytype + 4),local_40);
  if (local_50 != (PField *)0x0) {
    pp_Var1 = local_50->Type[1].super_PTypeBase.super_DObject._vptr_DObject;
    (**(code **)(*pp_Var1 + 0x78))
              (pp_Var1,(long)&_pos->_vptr_DObject +
                       (ulong)(uint)(*(int *)((long)&local_50->Type[1].super_PTypeBase.super_DObject
                                                     .Class + 4) * local_40) + local_50->Offset,
               var._4_4_);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserArray)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_INT	(pos);
	PARAM_INT	(value);

	// Set the value of the specified user array at index pos.
	PField *var = GetArrayVar(self, varname, pos);
	if (var != nullptr)
	{
		PArray *arraytype = static_cast<PArray *>(var->Type);
		arraytype->ElementType->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset + arraytype->ElementSize * pos, value);
	}
	return 0;
}